

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_79::Input::consume(Input *this,char expected)

{
  char current;
  char expected_local;
  Fault f;
  DebugComparison<char_&,_char_&> _kjCondition;
  
  expected_local = expected;
  current = nextChar(this);
  _kjCondition.left = &current;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = current == expected_local;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.right = &expected_local;
  if (_kjCondition.result) {
    advance(this,1);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char&>&,char_const(&)[34]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x244,FAILED,"current == expected",
             "_kjCondition,\"Unexpected input in JSON message.\"",&_kjCondition,
             (char (*) [34])"Unexpected input in JSON message.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void consume(char expected) {
    char current = nextChar();
    KJ_REQUIRE(current == expected, "Unexpected input in JSON message.");

    advance();
  }